

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestRunStats::TestRunStats(TestRunStats *this,TestRunStats *param_1)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  undefined4 uVar9;
  
  this->_vptr_TestRunStats = (_func_int **)&PTR__TestRunStats_005d3cc0;
  (this->runInfo).name._M_dataplus._M_p = (pointer)&(this->runInfo).name.field_2;
  pcVar1 = (param_1->runInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->runInfo,pcVar1,pcVar1 + (param_1->runInfo).name._M_string_length);
  iVar8 = (param_1->totals).error;
  uVar9 = *(undefined4 *)&(param_1->totals).field_0x4;
  sVar2 = (param_1->totals).skippedTests;
  sVar3 = (param_1->totals).assertions.passed;
  sVar4 = (param_1->totals).assertions.failed;
  sVar5 = (param_1->totals).assertions.failedButOk;
  sVar6 = (param_1->totals).testCases.passed;
  sVar7 = (param_1->totals).testCases.failedButOk;
  (this->totals).testCases.failed = (param_1->totals).testCases.failed;
  (this->totals).testCases.failedButOk = sVar7;
  (this->totals).assertions.failedButOk = sVar5;
  (this->totals).testCases.passed = sVar6;
  (this->totals).assertions.passed = sVar3;
  (this->totals).assertions.failed = sVar4;
  (this->totals).error = iVar8;
  *(undefined4 *)&(this->totals).field_0x4 = uVar9;
  (this->totals).skippedTests = sVar2;
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::_Rb_tree(&(this->totals).skippedTestReasons._M_t,&(param_1->totals).skippedTestReasons._M_t);
  this->aborting = param_1->aborting;
  return;
}

Assistant:

TestRunStats( TestRunStats const& )              = default;